

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O0

void anon_unknown.dwarf_178f1b::readPartialFiles(int randomReadCount,string *fn)

{
  bool bVar1;
  int iVar2;
  Array2D<float_*> *fData_00;
  char *pcVar3;
  reference pvVar4;
  uint *puVar5;
  int in_EDI;
  Box2i b2_1;
  Box2i b1_1;
  DeepFrameBuffer frameBuffer_3;
  int numYTiles_1;
  int numXTiles_1;
  int h_1;
  int w_1;
  int ly_1;
  int lx_1;
  int ty2_1;
  int ty1_1;
  int tx2_1;
  int tx1_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputPart part_3;
  int l2_1;
  int l1_1;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputPart part_2;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  TiledInputPart part_1;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  FrameBuffer frameBuffer;
  InputPart part;
  int l2;
  int l1;
  int levelMode;
  int pixelType;
  int partType;
  int partNumber;
  int i;
  MultiPartInputFile file;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  _Rb_tree_color in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  _Rb_tree_color in_stack_fffffffffffffba8;
  int iVar6;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined1 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbb9;
  undefined1 in_stack_fffffffffffffbba;
  undefined1 in_stack_fffffffffffffbbb;
  int in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  PixelType in_stack_fffffffffffffbc4;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc80;
  Array2D<unsigned_int_*> *in_stack_fffffffffffffc90;
  _Rb_tree_color in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  int in_stack_fffffffffffffcb0;
  Slice local_318 [104];
  undefined4 local_2b0;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  undefined4 local_284;
  undefined1 local_280 [72];
  Slice local_238 [104];
  DeepFrameBuffer local_1d0;
  undefined4 local_168;
  undefined4 local_164;
  FrameBuffer local_160;
  undefined1 local_110 [72];
  Array2D<unsigned_int> local_c8;
  Array2D<Imath_3_2::half_*> local_b0;
  Array2D<float_*> local_98;
  Array2D<unsigned_int_*> local_80;
  Array2D<Imath_3_2::half> local_68;
  Array2D<float> local_40;
  Array2D<unsigned_int> local_28;
  int local_4;
  
  local_4 = in_EDI;
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_28);
  Imf_3_4::Array2D<float>::Array2D(&local_40);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&local_68);
  Imf_3_4::Array2D<unsigned_int_*>::Array2D(&local_80);
  Imf_3_4::Array2D<float_*>::Array2D(&local_98);
  Imf_3_4::Array2D<Imath_3_2::half_*>::Array2D(&local_b0);
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_c8);
  fData_00 = (Array2D<float_*> *)std::operator<<((ostream *)&std::cout,"Reading partial files ");
  std::ostream::operator<<(fData_00,std::flush<char,std::char_traits<char>>);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)(local_110 + 0x28),pcVar3,iVar2,true);
  local_110._36_4_ = 0;
  do {
    if (local_4 <= (int)local_110._36_4_) {
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                );
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D
                ((Array2D<Imath_3_2::half_*> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<float_*>::~Array2D
                ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<unsigned_int_*>::~Array2D
                ((Array2D<unsigned_int_*> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                ((Array2D<Imath_3_2::half> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<float>::~Array2D
                ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      return;
    }
    Imf_3_4::MultiPartInputFile::parts();
    local_110._32_4_ = random_int(in_stack_fffffffffffffba4);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                        (long)(int)local_110._32_4_);
    local_110._28_4_ = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                        (long)(int)local_110._32_4_);
    local_110._24_4_ = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,
                        (long)(int)local_110._32_4_);
    local_110._20_4_ = *pvVar4;
    switch(local_110._28_4_) {
    case 0:
      local_110._16_4_ = random_int(in_stack_fffffffffffffba4);
      local_110._12_4_ = random_int(in_stack_fffffffffffffba4);
      if ((int)local_110._12_4_ < (int)local_110._16_4_) {
        std::swap<int>((int *)(local_110 + 0x10),(int *)(local_110 + 0xc));
      }
      Imf_3_4::InputPart::InputPart
                ((InputPart *)local_110,(MultiPartInputFile *)(local_110 + 0x28),local_110._32_4_);
      Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1bfd88);
      setInputFrameBuffer((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc9c,
                          (Array2D<unsigned_int> *)in_stack_fffffffffffffc90,
                          (Array2D<float> *)fData_00,
                          (Array2D<Imath_3_2::half> *)CONCAT44(iVar2,in_stack_fffffffffffffc80),
                          (int)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffcb0);
      Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)local_110);
      Imf_3_4::InputPart::readPixels((int)local_110,local_110._16_4_);
      if (local_110._24_4_ == 0) {
        bVar1 = checkPixels<unsigned_int>
                          ((Array2D<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffbbc,
                                    CONCAT13(in_stack_fffffffffffffbbb,
                                             CONCAT12(in_stack_fffffffffffffbba,
                                                      CONCAT11(in_stack_fffffffffffffbb9,
                                                               in_stack_fffffffffffffbb8)))),
                           in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                           in_stack_fffffffffffffbac,in_stack_fffffffffffffba8,
                           in_stack_fffffffffffffba4);
        if (!bVar1) {
          __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x572,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if (local_110._24_4_ == 1) {
        bVar1 = checkPixels<float>((Array2D<float> *)
                                   CONCAT44(in_stack_fffffffffffffbbc,
                                            CONCAT13(in_stack_fffffffffffffbbb,
                                                     CONCAT12(in_stack_fffffffffffffbba,
                                                              CONCAT11(in_stack_fffffffffffffbb9,
                                                                       in_stack_fffffffffffffbb8))))
                                   ,in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                                   in_stack_fffffffffffffbac,in_stack_fffffffffffffba8,
                                   in_stack_fffffffffffffba4);
        if (!bVar1) {
          __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x576,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if ((local_110._24_4_ == 2) &&
              (bVar1 = checkPixels<Imath_3_2::half>
                                 ((Array2D<Imath_3_2::half> *)
                                  CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                  in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                                  in_stack_fffffffffffffbbc,
                                  CONCAT13(in_stack_fffffffffffffbbb,
                                           CONCAT12(in_stack_fffffffffffffbba,
                                                    CONCAT11(in_stack_fffffffffffffbb9,
                                                             in_stack_fffffffffffffbb8))),
                                  in_stack_fffffffffffffbb4), !bVar1)) {
        __assert_fail("checkPixels<half> ( hData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x57a,
                      "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
      }
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1bff90);
      break;
    case 1:
      Imf_3_4::TiledInputPart::TiledInputPart
                ((TiledInputPart *)&local_160,(MultiPartInputFile *)(local_110 + 0x28),
                 local_110._32_4_);
      local_164 = Imf_3_4::TiledInputPart::numXLevels();
      local_168 = Imf_3_4::TiledInputPart::numYLevels();
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           random_int(in_stack_fffffffffffffba4);
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           random_int(in_stack_fffffffffffffba4);
      if (local_110._20_4_ == 1) {
        local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      }
      local_1d0._100_4_ = Imf_3_4::TiledInputPart::levelWidth((int)&local_160);
      local_1d0._96_4_ = Imf_3_4::TiledInputPart::levelHeight((int)&local_160);
      local_1d0._92_4_ = Imf_3_4::TiledInputPart::numXTiles((int)&local_160);
      local_1d0._88_4_ = Imf_3_4::TiledInputPart::numYTiles((int)&local_160);
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           random_int(in_stack_fffffffffffffba4);
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           random_int(in_stack_fffffffffffffba4);
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
           random_int(in_stack_fffffffffffffba4);
      local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
           random_int(in_stack_fffffffffffffba4);
      if ((int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left <
          local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_) {
        std::swap<int>((int *)((long)&local_160._map._M_t._M_impl.super__Rb_tree_header._M_header +
                              0x14),
                       (int *)((long)&local_160._map._M_t._M_impl.super__Rb_tree_header._M_header +
                              0x10));
      }
      if ((int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent <
          local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_) {
        std::swap<int>((int *)((long)&local_160._map._M_t._M_impl.super__Rb_tree_header._M_header +
                              0xc),
                       (int *)((long)&local_160._map._M_t._M_impl.super__Rb_tree_header._M_header +
                              8));
      }
      Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1c01f0);
      setInputFrameBuffer((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc9c,
                          (Array2D<unsigned_int> *)in_stack_fffffffffffffc90,
                          (Array2D<float> *)fData_00,
                          (Array2D<Imath_3_2::half> *)CONCAT44(iVar2,in_stack_fffffffffffffc80),
                          (int)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffcb0);
      Imf_3_4::TiledInputPart::setFrameBuffer(&local_160);
      Imf_3_4::TiledInputPart::readTiles
                ((int)&local_160,
                 local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,
                 (int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                 (int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_);
      Imf_3_4::TiledInputPart::dataWindowForTile
                ((int)&local_1d0 + 0x18,(int)&local_160,
                 local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,
                 local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_);
      Imf_3_4::TiledInputPart::dataWindowForTile
                ((int)&local_1d0 + 8,(int)&local_160,
                 (int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (int)local_160._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      if (local_110._24_4_ == 0) {
        bVar1 = checkPixels<unsigned_int>
                          ((Array2D<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffbbc,
                                    CONCAT13(in_stack_fffffffffffffbbb,
                                             CONCAT12(in_stack_fffffffffffffbba,
                                                      CONCAT11(in_stack_fffffffffffffbb9,
                                                               in_stack_fffffffffffffbb8)))),
                           in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                           in_stack_fffffffffffffbac,in_stack_fffffffffffffba8,
                           in_stack_fffffffffffffba4);
        if (!bVar1) {
          __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x5a7,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if (local_110._24_4_ == 1) {
        bVar1 = checkPixels<float>((Array2D<float> *)
                                   CONCAT44(in_stack_fffffffffffffbbc,
                                            CONCAT13(in_stack_fffffffffffffbbb,
                                                     CONCAT12(in_stack_fffffffffffffbba,
                                                              CONCAT11(in_stack_fffffffffffffbb9,
                                                                       in_stack_fffffffffffffbb8))))
                                   ,in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                                   in_stack_fffffffffffffbac,in_stack_fffffffffffffba8,
                                   in_stack_fffffffffffffba4);
        if (!bVar1) {
          __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x5ab,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if ((local_110._24_4_ == 2) &&
              (bVar1 = checkPixels<Imath_3_2::half>
                                 ((Array2D<Imath_3_2::half> *)
                                  CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                  in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0,
                                  in_stack_fffffffffffffbbc,
                                  CONCAT13(in_stack_fffffffffffffbbb,
                                           CONCAT12(in_stack_fffffffffffffbba,
                                                    CONCAT11(in_stack_fffffffffffffbb9,
                                                             in_stack_fffffffffffffbb8))),
                                  in_stack_fffffffffffffbb4), !bVar1)) {
        __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x5af,
                      "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
      }
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1c048a);
      break;
    case 2:
      Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                ((DeepScanLineInputPart *)&local_1d0,(MultiPartInputFile *)(local_110 + 0x28),
                 local_110._32_4_);
      Imf_3_4::DeepFrameBuffer::DeepFrameBuffer
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      Imf_3_4::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 CONCAT44(in_stack_fffffffffffffbbc,
                          CONCAT13(in_stack_fffffffffffffbbb,
                                   CONCAT12(in_stack_fffffffffffffbba,
                                            CONCAT11(in_stack_fffffffffffffbb9,
                                                     in_stack_fffffffffffffbb8)))),
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_c8,0);
      iVar6 = 0;
      Imf_3_4::Slice::Slice
                ((Slice *)(local_280 + 0x10),UINT,(char *)puVar5,4,0x304,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_238);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc90,fData_00,
                 (Array2D<Imath_3_2::half_*> *)CONCAT44(iVar2,in_stack_fffffffffffffc80),
                 (int)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffcb0);
      Imf_3_4::DeepScanLineInputPart::setFrameBuffer(&local_1d0);
      local_280._12_4_ = random_int(in_stack_fffffffffffffba4);
      local_280._8_4_ = random_int(in_stack_fffffffffffffba4);
      if ((int)local_280._8_4_ < (int)local_280._12_4_) {
        std::swap<int>((int *)(local_280 + 0xc),(int *)(local_280 + 8));
      }
      Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)&local_1d0,local_280._12_4_);
      bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffbbc,
                                        CONCAT13(in_stack_fffffffffffffbbb,
                                                 CONCAT12(in_stack_fffffffffffffbba,
                                                          CONCAT11(in_stack_fffffffffffffbb9,
                                                                   in_stack_fffffffffffffbb8)))),
                               in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                               in_stack_fffffffffffffbac,iVar6,in_stack_fffffffffffffba4);
      in_stack_fffffffffffffc00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc00);
      if (!bVar1) {
        __assert_fail("checkSampleCount ( sampleCount, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x5d3,
                      "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
      }
      in_stack_fffffffffffffba8 = local_280._8_4_;
      allocatePixels(in_stack_fffffffffffffbe4,
                     (Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                     (Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     (Array2D<float_*> *)
                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (Array2D<Imath_3_2::half_*> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8,
                     in_stack_fffffffffffffc00);
      Imf_3_4::DeepScanLineInputPart::readPixels((int)&local_1d0,local_280._12_4_);
      if (local_110._24_4_ == 0) {
        bVar1 = checkPixels<unsigned_int>
                          ((Array2D<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                           (Array2D<unsigned_int_*> *)
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           in_stack_fffffffffffffbbc,
                           CONCAT13(in_stack_fffffffffffffbbb,
                                    CONCAT12(in_stack_fffffffffffffbba,
                                             CONCAT11(in_stack_fffffffffffffbb9,
                                                      in_stack_fffffffffffffbb8))),
                           in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                           in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffbf8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbf8);
        if (!bVar1) {
          __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x5ec,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if (local_110._24_4_ == 1) {
        bVar1 = checkPixels<float>((Array2D<unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                   (Array2D<float_*> *)
                                   CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                                   in_stack_fffffffffffffbbc,
                                   CONCAT13(in_stack_fffffffffffffbbb,
                                            CONCAT12(in_stack_fffffffffffffbba,
                                                     CONCAT11(in_stack_fffffffffffffbb9,
                                                              in_stack_fffffffffffffbb8))),
                                   in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                                   in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffbf8 =
             CONCAT13((char)((uint)in_stack_fffffffffffffbf8 >> 0x18),
                      CONCAT12(bVar1,(short)in_stack_fffffffffffffbf8));
        if (!bVar1) {
          __assert_fail("checkPixels<float> ( sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x5f6,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if (local_110._24_4_ == 2) {
        bVar1 = checkPixels<Imath_3_2::half>
                          ((Array2D<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                           (Array2D<Imath_3_2::half_*> *)
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           in_stack_fffffffffffffbbc,
                           CONCAT13(in_stack_fffffffffffffbbb,
                                    CONCAT12(in_stack_fffffffffffffbba,
                                             CONCAT11(in_stack_fffffffffffffbb9,
                                                      in_stack_fffffffffffffbb8))),
                           in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                           in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffbf8 =
             CONCAT22((short)((uint)in_stack_fffffffffffffbf8 >> 0x10),
                      CONCAT11(bVar1,(char)in_stack_fffffffffffffbf8));
        if (!bVar1) {
          __assert_fail("checkPixels<half> ( sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x600,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      in_stack_fffffffffffffba0 = local_280._8_4_;
      releasePixels(in_stack_fffffffffffffbd4,
                    (Array2D<unsigned_int_*> *)
                    CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                    (Array2D<float_*> *)
                    CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                    (Array2D<Imath_3_2::half_*> *)
                    CONCAT44(in_stack_fffffffffffffbbc,
                             CONCAT13(in_stack_fffffffffffffbbb,
                                      CONCAT12(in_stack_fffffffffffffbba,
                                               CONCAT11(in_stack_fffffffffffffbb9,
                                                        in_stack_fffffffffffffbb8)))),
                    in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0,
                    in_stack_fffffffffffffbe8);
      Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1c08b5);
      break;
    case 3:
      Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                ((DeepTiledInputPart *)local_280,(MultiPartInputFile *)(local_110 + 0x28),
                 local_110._32_4_);
      local_284 = Imf_3_4::DeepTiledInputPart::numXLevels();
      in_stack_fffffffffffffbf0 = Imf_3_4::DeepTiledInputPart::numYLevels();
      local_288 = in_stack_fffffffffffffbf0;
      local_29c = random_int(in_stack_fffffffffffffba4);
      in_stack_fffffffffffffbe8 = random_int(in_stack_fffffffffffffba4);
      local_2a0 = in_stack_fffffffffffffbe8;
      if (local_110._20_4_ == 1) {
        local_2a0 = local_29c;
      }
      in_stack_fffffffffffffbe4 = Imf_3_4::DeepTiledInputPart::levelWidth((int)local_280);
      local_2a4 = in_stack_fffffffffffffbe4;
      in_stack_fffffffffffffbe0 = Imf_3_4::DeepTiledInputPart::levelHeight((int)local_280);
      local_2a8 = in_stack_fffffffffffffbe0;
      in_stack_fffffffffffffbdc = Imf_3_4::DeepTiledInputPart::numXTiles((int)local_280);
      local_2ac = in_stack_fffffffffffffbdc;
      in_stack_fffffffffffffbd8 = Imf_3_4::DeepTiledInputPart::numYTiles((int)local_280);
      local_2b0 = in_stack_fffffffffffffbd8;
      in_stack_fffffffffffffbd4 = random_int(in_stack_fffffffffffffba4);
      local_28c = in_stack_fffffffffffffbd4;
      in_stack_fffffffffffffbd0 = random_int(in_stack_fffffffffffffba4);
      local_290 = in_stack_fffffffffffffbd0;
      in_stack_fffffffffffffbcc = random_int(in_stack_fffffffffffffba4);
      local_294 = in_stack_fffffffffffffbcc;
      in_stack_fffffffffffffbc8 = random_int(in_stack_fffffffffffffba4);
      in_stack_fffffffffffffba8 = in_stack_fffffffffffffc9c;
      local_298 = in_stack_fffffffffffffbc8;
      if (local_290 < local_28c) {
        std::swap<int>(&local_28c,&local_290);
        in_stack_fffffffffffffba8 = in_stack_fffffffffffffc9c;
      }
      if (local_298 < local_294) {
        std::swap<int>(&local_294,&local_298);
      }
      Imf_3_4::DeepFrameBuffer::DeepFrameBuffer
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      Imf_3_4::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 CONCAT44(in_stack_fffffffffffffbbc,
                          CONCAT13(in_stack_fffffffffffffbbb,
                                   CONCAT12(in_stack_fffffffffffffbba,
                                            CONCAT11(in_stack_fffffffffffffbb9,
                                                     in_stack_fffffffffffffbb8)))),
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      in_stack_fffffffffffffbc4 = UINT;
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_c8,0);
      iVar6 = 0;
      Imf_3_4::Slice::Slice
                ((Slice *)&stack0xfffffffffffffcb0,in_stack_fffffffffffffbc4,(char *)puVar5,4,
                 (long)local_2a4 << 2,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_318);
      setInputDeepFrameBuffer
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffc90,fData_00,
                 (Array2D<Imath_3_2::half_*> *)CONCAT44(iVar2,in_stack_fffffffffffffc80),
                 (int)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffcb0);
      Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_280);
      Imf_3_4::DeepTiledInputPart::readPixelSampleCounts
                ((int)local_280,local_28c,local_290,local_294,local_298,local_29c);
      Imf_3_4::DeepTiledInputPart::dataWindowForTile
                ((int)&stack0xfffffffffffffca0,(int)local_280,local_28c,local_294);
      Imf_3_4::DeepTiledInputPart::dataWindowForTile
                ((int)&stack0xfffffffffffffc90,(int)local_280,local_290,local_298);
      bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffbbc,
                                        CONCAT13(in_stack_fffffffffffffbbb,
                                                 CONCAT12(in_stack_fffffffffffffbba,
                                                          CONCAT11(in_stack_fffffffffffffbb9,
                                                                   in_stack_fffffffffffffbb8)))),
                               in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                               in_stack_fffffffffffffbac,iVar6,in_stack_fffffffffffffba4);
      in_stack_fffffffffffffbc0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbc0);
      if (!bVar1) {
        __assert_fail("checkSampleCount ( sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x640,
                      "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
      }
      in_stack_fffffffffffffba0 = in_stack_fffffffffffffba8;
      allocatePixels(in_stack_fffffffffffffbe4,
                     (Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                     (Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     (Array2D<float_*> *)
                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (Array2D<Imath_3_2::half_*> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbbc,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8,
                     in_stack_fffffffffffffc00);
      Imf_3_4::DeepTiledInputPart::readTiles
                ((int)local_280,local_28c,local_290,local_294,local_298,local_29c);
      in_stack_fffffffffffffbbc = local_110._24_4_;
      if (local_110._24_4_ == 0) {
        in_stack_fffffffffffffbbb =
             checkPixels<unsigned_int>
                       ((Array2D<unsigned_int> *)
                        CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                        (Array2D<unsigned_int_*> *)
                        CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),0,
                        CONCAT13(in_stack_fffffffffffffbbb,
                                 CONCAT12(in_stack_fffffffffffffbba,
                                          CONCAT11(in_stack_fffffffffffffbb9,
                                                   in_stack_fffffffffffffbb8))),
                        in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                        in_stack_fffffffffffffbe0);
        if (!(bool)in_stack_fffffffffffffbbb) {
          __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x659,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if (local_110._24_4_ == 1) {
        in_stack_fffffffffffffbba =
             checkPixels<float>((Array2D<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                                (Array2D<float_*> *)
                                CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),1,
                                CONCAT13(in_stack_fffffffffffffbbb,
                                         CONCAT12(in_stack_fffffffffffffbba,
                                                  CONCAT11(in_stack_fffffffffffffbb9,
                                                           in_stack_fffffffffffffbb8))),
                                in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                                in_stack_fffffffffffffbe0);
        if (!(bool)in_stack_fffffffffffffbba) {
          __assert_fail("checkPixels<float> ( sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                        ,0x663,
                        "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
        }
      }
      else if ((local_110._24_4_ == 2) &&
              (in_stack_fffffffffffffbb9 =
                    checkPixels<Imath_3_2::half>
                              ((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               (Array2D<Imath_3_2::half_*> *)
                               CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),2,
                               CONCAT13(in_stack_fffffffffffffbbb,
                                        CONCAT12(in_stack_fffffffffffffbba,
                                                 CONCAT11(in_stack_fffffffffffffbb9,
                                                          in_stack_fffffffffffffbb8))),
                               in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                               in_stack_fffffffffffffbe0), !(bool)in_stack_fffffffffffffbb9)) {
        __assert_fail("checkPixels<half> ( sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x66d,
                      "void (anonymous namespace)::readPartialFiles(int, const std::string &)");
      }
      in_stack_fffffffffffffc9c = in_stack_fffffffffffffba0;
      releasePixels(in_stack_fffffffffffffbd4,
                    (Array2D<unsigned_int_*> *)
                    CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                    (Array2D<float_*> *)
                    CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                    (Array2D<Imath_3_2::half_*> *)
                    CONCAT44(in_stack_fffffffffffffbbc,
                             CONCAT13(in_stack_fffffffffffffbbb,
                                      CONCAT12(in_stack_fffffffffffffbba,
                                               CONCAT11(in_stack_fffffffffffffbb9,
                                                        in_stack_fffffffffffffbb8)))),
                    in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0,
                    in_stack_fffffffffffffbe8);
      Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1c0f5e);
    }
    local_110._36_4_ = local_110._36_4_ + 1;
  } while( true );
}

Assistant:

void
readPartialFiles (int randomReadCount, const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    cout << "Reading partial files " << flush;
    MultiPartInputFile file (fn.c_str ());
    //const vector<Header>& headers = file.parts();
    for (int i = 0; i < randomReadCount; i++)
    {
        int partNumber = random_int (headers.size ());
        int partType   = partTypes[partNumber];
        int pixelType  = pixelTypes[partNumber];
        int levelMode  = levelModes[partNumber];

        if (partType == 0)
        {
            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            InputPart part (file, partNumber);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }
        }
        else
        {
            int tx1, tx2, ty1, ty2;
            int lx, ly;

            TiledInputPart part (file, partNumber);

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }
        }
    }
}